

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O2

Expected<llvm::DWARFDebugRnglist> * __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
          (Expected<llvm::DWARFDebugRnglist> *__return_storage_ptr__,
          DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,uint64_t Offset)

{
  uint64_t uVar1;
  iterator iVar2;
  uint64_t uVar3;
  mapped_type *this_00;
  size_t in_R9;
  StringRef SectionName;
  uint64_t local_68;
  uint64_t Offset_local;
  uint64_t StartingOffset;
  DWARFDebugRnglist List;
  Error local_38;
  pointer local_30;
  
  local_68 = Offset;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
          ::find(&(this->ListMap)._M_t,&local_68);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->ListMap)._M_t._M_impl.super__Rb_tree_header) {
    StartingOffset = 0;
    List.super_DWARFListType<llvm::RangeListEntry>.Entries.
    super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    List.super_DWARFListType<llvm::RangeListEntry>.Entries.
    super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar1 = (this->Header).HeaderOffset;
    uVar3 = DWARFListTableHeader::length(&this->Header);
    Offset_local = local_68;
    SectionName.Length = in_R9;
    SectionName.Data = (char *)&local_68;
    DWARFListType<llvm::RangeListEntry>::extract
              ((DWARFListType<llvm::RangeListEntry> *)&local_30,Data,(uint64_t)&StartingOffset,
               (this->Header).HeaderOffset,(uint64_t *)(uVar3 + uVar1),SectionName,
               (this->Header).SectionName);
    if (local_30 < (pointer)0x2) {
      this_00 = std::
                map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                ::operator[](&this->ListMap,&Offset_local);
      std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::operator=
                ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this_00,
                 (vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
                 &StartingOffset);
      Expected<llvm::DWARFDebugRnglist>::Expected<llvm::DWARFDebugRnglist>
                (__return_storage_ptr__,(DWARFDebugRnglist *)&StartingOffset,(type *)0x0);
    }
    else {
      local_38.Payload = (ErrorInfoBase *)((ulong)local_30 | 1);
      local_30 = (pointer)0x0;
      Expected<llvm::DWARFDebugRnglist>::Expected(__return_storage_ptr__,&local_38);
      if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
      }
      if ((long *)((ulong)local_30 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_30 & 0xfffffffffffffffe) + 8))();
      }
    }
    std::_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::~_Vector_base
              ((_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
               &StartingOffset);
  }
  else {
    Expected<llvm::DWARFDebugRnglist>::Expected<llvm::DWARFDebugRnglist&>
              (__return_storage_ptr__,(DWARFDebugRnglist *)&iVar2._M_node[1]._M_parent,(type *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFListType>
DWARFListTableBase<DWARFListType>::findList(DWARFDataExtractor Data,
                                            uint64_t Offset) {
  auto Entry = ListMap.find(Offset);
  if (Entry != ListMap.end())
    return Entry->second;

  // Extract the list from the section and enter it into the list map.
  DWARFListType List;
  uint64_t End = getHeaderOffset() + Header.length();
  uint64_t StartingOffset = Offset;
  if (Error E =
          List.extract(Data, getHeaderOffset(), End, &Offset,
                       Header.getSectionName(), Header.getListTypeString()))
    return std::move(E);
  ListMap[StartingOffset] = List;
  return List;
}